

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::evaluate
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression **expr,QOperation previous_oper)

{
  bool bVar1;
  undefined1 local_50 [8];
  QExpression right;
  QExpression *next_expr;
  QOperation previous_oper_local;
  QExpression **expr_local;
  QExpression *left_local;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this_local;
  
  QExpression::QExpression((QExpression *)local_50);
  bVar1 = GetExpressionValue(this,left,*expr,(*expr)->Operation);
  if (bVar1) {
    do {
      while( true ) {
        if ((*expr)->Operation == NoOp) {
          this_local._7_1_ = left->Type != NotANumber;
          goto LAB_00120213;
        }
        right._16_8_ = *expr + 1;
        if ((*expr)[1].Operation <= (*expr)->Operation) break;
        bVar1 = evaluate(this,(QExpression *)local_50,(QExpression **)&right.Operation,
                         (*expr)->Operation);
        if ((!bVar1) ||
           (bVar1 = evaluateExpression(this,left,(QExpression *)local_50,(*expr)->Operation), !bVar1
           )) {
LAB_001201e2:
          this_local._7_1_ = false;
          goto LAB_00120213;
        }
        *expr = (QExpression *)right._16_8_;
      }
      bVar1 = GetExpressionValue(this,(QExpression *)local_50,(QExpression *)right._16_8_,
                                 (*expr)->Operation);
      if ((!bVar1) ||
         (bVar1 = evaluateExpression(this,left,(QExpression *)local_50,(*expr)->Operation), !bVar1))
      goto LAB_001201e2;
      *expr = (QExpression *)right._16_8_;
    } while (previous_oper < (*expr)->Operation);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_00120213:
  QExpression::~QExpression((QExpression *)local_50);
  return this_local._7_1_;
}

Assistant:

bool evaluate(QExpression &left, const QExpression *&expr, const QOperation previous_oper) const noexcept {
        const QExpression *next_expr;
        QExpression        right;

        if (GetExpressionValue(left, expr, expr->Operation)) {
            while (expr->Operation != QOperation::NoOp) {
                next_expr = (expr + 1U);

                if (expr->Operation >= next_expr->Operation) {
                    if (GetExpressionValue(right, next_expr, expr->Operation) &&
                        evaluateExpression(left, right, expr->Operation)) {
                        expr = next_expr;

                        if (previous_oper < expr->Operation) {
                            continue;
                        }

                        return true;
                    }
                } else if (evaluate(right, next_expr, expr->Operation) &&
                           evaluateExpression(left, right, expr->Operation)) {
                    expr = next_expr;
                    continue;
                }

                return false;
            }

            return (left.Type != ExpressionType::NotANumber);
        }

        return false;
    }